

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_verify.cpp
# Opt level: O1

ErrorData * __thiscall
duckdb::ClientContext::VerifyQuery
          (ErrorData *__return_storage_ptr__,ClientContext *this,ClientContextLock *lock,
          string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer pcVar4;
  size_t sVar5;
  ExceptionType EVar6;
  undefined4 uVar7;
  unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true> uVar8;
  pointer puVar9;
  __alloc_node_gen_t _Var10;
  uint uVar11;
  int iVar12;
  type pSVar13;
  unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_> this_00;
  pointer pSVar14;
  type pSVar15;
  type pMVar16;
  ExceptionType *pEVar17;
  type pDVar18;
  MetaTransaction *transaction;
  ValidChecker *pVVar19;
  pointer pMVar20;
  pointer pSVar21;
  unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_> this_01;
  pointer pEVar22;
  case_insensitive_map_t<idx_t> *this_02;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *statement_00;
  unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
  *verifier;
  ErrorData *pEVar23;
  pointer puVar24;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  parameters_local;
  templated_unique_single_t original;
  unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
  prepared_statement_verifier;
  templated_unique_single_t explain_stmt;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
  statement_copy_for_explain;
  vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_true>
  statement_verifiers;
  _Head_base<0UL,_duckdb::ExplainStatement_*,_false> local_160;
  __alloc_node_gen_t __alloc_node_gen;
  undefined1 local_148 [120];
  undefined1 local_d0 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> explain_q;
  case_insensitive_map_t<idx_t> original_named_param_map;
  
  parameters_local = parameters;
  pSVar13 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
            operator*(statement);
  statement_verifiers.
  super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  statement_verifiers.
  super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statement_verifiers.
  super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prepared_statement_verifier.
  super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>._M_t.
  super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
  .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
       (__uniq_ptr_data<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true,_true>
        )0x0;
  if ((this->config).query_verification_enabled == true) {
    StatementVerifier::Create
              ((StatementVerifier *)&__alloc_node_gen,COPIED,pSVar13,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&__alloc_node_gen);
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
      (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
    }
    StatementVerifier::Create
              ((StatementVerifier *)&__alloc_node_gen,DESERIALIZED,pSVar13,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&__alloc_node_gen);
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
      (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
    }
    StatementVerifier::Create
              ((StatementVerifier *)&__alloc_node_gen,UNOPTIMIZED,pSVar13,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&__alloc_node_gen);
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
      (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
    }
    if (parameters_local.ptr !=
        (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
         *)0x0) {
      optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
      ::CheckValid(&parameters_local);
      if (((parameters_local.ptr)->_M_h)._M_element_count != 0) goto LAB_01672f36;
    }
    StatementVerifier::Create
              ((StatementVerifier *)&__alloc_node_gen,PREPARED,pSVar13,parameters_local);
    _Var10 = __alloc_node_gen;
    uVar8 = prepared_statement_verifier;
    __alloc_node_gen._M_h = (__hashtable_alloc *)0x0;
    prepared_statement_verifier.
    super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
    .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl =
         (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         _Var10._M_h;
    if (uVar8.
        super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
        .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)uVar8.
                            super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
                            .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl
                  + 8))();
    }
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
      (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
    }
  }
LAB_01672f36:
  if ((this->config).verify_fetch_row == true) {
    StatementVerifier::Create
              ((StatementVerifier *)&__alloc_node_gen,FETCH_ROW_AS_SCAN,pSVar13,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&__alloc_node_gen);
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
      (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
    }
  }
  if ((this->config).verify_external == true) {
    StatementVerifier::Create
              ((StatementVerifier *)&__alloc_node_gen,EXTERNAL,pSVar13,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&__alloc_node_gen);
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
      (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
    }
  }
  this_00._M_t.
  super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
  .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true,_true>
        )operator_new(0x50);
  __alloc_node_gen._M_h =
       (__hashtable_alloc *)
       (statement->
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (statement->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
  _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  StatementVerifier::StatementVerifier
            ((StatementVerifier *)
             this_00._M_t.
             super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
             .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             &__alloc_node_gen,parameters_local);
  original.
  super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>._M_t.
  super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
  .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
       (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
       this_00._M_t.
       super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
       .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl;
  if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
    (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
  }
  puVar9 = statement_verifiers.
           super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (statement_verifiers.
      super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      statement_verifiers.
      super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar24 = statement_verifiers.
              super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator->(&original);
      pSVar15 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator*(puVar24);
      StatementVerifier::CheckExpressions(pSVar14,pSVar15);
      puVar24 = puVar24 + 1;
    } while (puVar24 != puVar9);
  }
  pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
            ::operator->(&original);
  StatementVerifier::CheckExpressions(pSVar14);
  (*pSVar13->_vptr_SQLStatement[3])(&statement_copy_for_explain,pSVar13);
  bVar1 = (this->config).enable_profiler;
  if (bVar1 == true) {
    (this->config).enable_profiler = false;
  }
  bVar2 = (this->config).enable_optimizer;
  bVar3 = (this->config).force_external;
  pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
            ::operator->(&original);
  local_148._8_8_ =
       ::std::
       _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:99:34)>
       ::_M_invoke;
  local_148._0_8_ =
       ::std::
       _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:99:34)>
       ::_M_manager;
  __alloc_node_gen._M_h = (__hashtable_alloc *)this;
  uVar11 = (*pSVar14->_vptr_StatementVerifier[2])(pSVar14,this,query);
  if ((code *)local_148._0_8_ != (code *)0x0) {
    (*(code *)local_148._0_8_)(&__alloc_node_gen,&__alloc_node_gen,3);
  }
  if ((char)uVar11 == '\0') {
    pSVar13 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
              operator*(&statement_copy_for_explain);
    StatementVerifier::Create
              ((StatementVerifier *)&__alloc_node_gen,PARSED,pSVar13,parameters_local);
    ::std::
    vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                *)&statement_verifiers,
               (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                *)&__alloc_node_gen);
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
      (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
    }
  }
  puVar9 = statement_verifiers.
           super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (statement_verifiers.
      super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      statement_verifiers.
      super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar24 = statement_verifiers.
              super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator->(puVar24);
      local_148._8_8_ =
           ::std::
           _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:110:31)>
           ::_M_invoke;
      local_148._0_8_ =
           ::std::
           _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:110:31)>
           ::_M_manager;
      __alloc_node_gen._M_h = (__hashtable_alloc *)this;
      iVar12 = (*pSVar14->_vptr_StatementVerifier[2])(pSVar14,this,query,&__alloc_node_gen);
      if ((code *)local_148._0_8_ != (code *)0x0) {
        (*(code *)local_148._0_8_)(&__alloc_node_gen,&__alloc_node_gen,3);
      }
      uVar11 = (uint)(byte)((byte)uVar11 | (byte)iVar12);
      puVar24 = puVar24 + 1;
    } while (puVar24 != puVar9);
  }
  if (((uVar11 & 1) == 0) &&
     (prepared_statement_verifier.
      super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
      .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true,_true>
       )0x0)) {
    pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
              ::operator->(&prepared_statement_verifier);
    local_148._8_8_ =
         ::std::
         _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:121:7)>
         ::_M_invoke;
    local_148._0_8_ =
         ::std::
         _Function_handler<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_verify.cpp:121:7)>
         ::_M_manager;
    __alloc_node_gen._M_h = (__hashtable_alloc *)this;
    iVar12 = (*pSVar14->_vptr_StatementVerifier[2])(pSVar14,this,query);
    if ((code *)local_148._0_8_ != (code *)0x0) {
      (*(code *)local_148._0_8_)(&__alloc_node_gen,&__alloc_node_gen,3);
    }
    if ((char)iVar12 == '\0') {
      ::std::
      vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>
                ((vector<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,std::default_delete<duckdb::StatementVerifier>,true>>>
                  *)&statement_verifiers,&prepared_statement_verifier);
    }
    else {
      pSVar15 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator*(&prepared_statement_verifier);
      if ((pSVar15->materialized_result).
          super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
          .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl !=
          (MaterializedQueryResult *)0x0) {
        pMVar16 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  ::operator*(&pSVar15->materialized_result);
        if ((pMVar16->super_QueryResult).super_BaseQueryResult.success == false) {
          pEVar23 = &(pMVar16->super_QueryResult).super_BaseQueryResult.error;
          pEVar17 = ErrorData::Type(pEVar23);
          if (*pEVar17 == INTERNAL) {
            __alloc_node_gen._M_h = (__hashtable_alloc *)local_148;
            local_148._0_8_ = local_148._0_8_ & 0xffffffffffffff00;
            ErrorData::Throw(pEVar23,(string *)&__alloc_node_gen);
          }
        }
      }
    }
  }
  else {
    pDVar18 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&this->db);
    if (((pDVar18->db_validity).is_invalidated._M_base._M_i & 1U) != 0) {
      pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator->(&original);
      pMVar20 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                ::operator->(&pSVar14->materialized_result);
      EVar6 = (pMVar20->super_QueryResult).super_BaseQueryResult.error.type;
      __return_storage_ptr__->initialized =
           (pMVar20->super_QueryResult).super_BaseQueryResult.error.initialized;
      __return_storage_ptr__->type = EVar6;
      (__return_storage_ptr__->raw_message)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->raw_message).field_2;
      pcVar4 = (pMVar20->super_QueryResult).super_BaseQueryResult.error.raw_message._M_dataplus._M_p
      ;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->raw_message,pcVar4,
                 pcVar4 + (pMVar20->super_QueryResult).super_BaseQueryResult.error.raw_message.
                          _M_string_length);
      (__return_storage_ptr__->final_message)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->final_message).field_2;
      pcVar4 = (pMVar20->super_QueryResult).super_BaseQueryResult.error.final_message._M_dataplus.
               _M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->final_message,pcVar4,
                 pcVar4 + (pMVar20->super_QueryResult).super_BaseQueryResult.error.final_message.
                          _M_string_length);
      __alloc_node_gen._M_h = (__hashtable_alloc *)&__return_storage_ptr__->extra_info;
      (__return_storage_ptr__->extra_info)._M_h._M_buckets = (__buckets_ptr)0x0;
      (__return_storage_ptr__->extra_info)._M_h._M_bucket_count =
           (pMVar20->super_QueryResult).super_BaseQueryResult.error.extra_info._M_h._M_bucket_count;
      (__return_storage_ptr__->extra_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__return_storage_ptr__->extra_info)._M_h._M_element_count =
           (pMVar20->super_QueryResult).super_BaseQueryResult.error.extra_info._M_h._M_element_count
      ;
      pEVar23 = &(pMVar20->super_QueryResult).super_BaseQueryResult.error;
      uVar7 = *(undefined4 *)&(pEVar23->extra_info)._M_h._M_rehash_policy.field_0x4;
      sVar5 = (pMVar20->super_QueryResult).super_BaseQueryResult.error.extra_info._M_h.
              _M_rehash_policy._M_next_resize;
      (__return_storage_ptr__->extra_info)._M_h._M_rehash_policy._M_max_load_factor =
           (pEVar23->extra_info)._M_h._M_rehash_policy._M_max_load_factor;
      *(undefined4 *)&(__return_storage_ptr__->extra_info)._M_h._M_rehash_policy.field_0x4 = uVar7;
      (__return_storage_ptr__->extra_info)._M_h._M_rehash_policy._M_next_resize = sVar5;
      (__return_storage_ptr__->extra_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)__alloc_node_gen._M_h,
                 &(pMVar20->super_QueryResult).super_BaseQueryResult.error.extra_info._M_h,
                 &__alloc_node_gen);
      goto LAB_01673710;
    }
    if ((this->transaction).current_transaction.
        super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
        .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl !=
        (MetaTransaction *)0x0) {
      transaction = TransactionContext::ActiveTransaction(&this->transaction);
      pVVar19 = ValidChecker::Get(transaction);
      if (((pVVar19->is_invalidated)._M_base._M_i & 1U) != 0) {
        pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                  ::operator->(&original);
        pMVar20 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  ::operator->(&pSVar14->materialized_result);
        EVar6 = (pMVar20->super_QueryResult).super_BaseQueryResult.error.type;
        __return_storage_ptr__->initialized =
             (pMVar20->super_QueryResult).super_BaseQueryResult.error.initialized;
        __return_storage_ptr__->type = EVar6;
        (__return_storage_ptr__->raw_message)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->raw_message).field_2;
        pcVar4 = (pMVar20->super_QueryResult).super_BaseQueryResult.error.raw_message._M_dataplus.
                 _M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->raw_message,pcVar4,
                   pcVar4 + (pMVar20->super_QueryResult).super_BaseQueryResult.error.raw_message.
                            _M_string_length);
        (__return_storage_ptr__->final_message)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->final_message).field_2;
        pcVar4 = (pMVar20->super_QueryResult).super_BaseQueryResult.error.final_message._M_dataplus.
                 _M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->final_message,pcVar4,
                   pcVar4 + (pMVar20->super_QueryResult).super_BaseQueryResult.error.final_message.
                            _M_string_length);
        __alloc_node_gen._M_h = (__hashtable_alloc *)&__return_storage_ptr__->extra_info;
        (__return_storage_ptr__->extra_info)._M_h._M_buckets = (__buckets_ptr)0x0;
        (__return_storage_ptr__->extra_info)._M_h._M_bucket_count =
             (pMVar20->super_QueryResult).super_BaseQueryResult.error.extra_info._M_h.
             _M_bucket_count;
        (__return_storage_ptr__->extra_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__return_storage_ptr__->extra_info)._M_h._M_element_count =
             (pMVar20->super_QueryResult).super_BaseQueryResult.error.extra_info._M_h.
             _M_element_count;
        pEVar23 = &(pMVar20->super_QueryResult).super_BaseQueryResult.error;
        uVar7 = *(undefined4 *)&(pEVar23->extra_info)._M_h._M_rehash_policy.field_0x4;
        sVar5 = (pMVar20->super_QueryResult).super_BaseQueryResult.error.extra_info._M_h.
                _M_rehash_policy._M_next_resize;
        (__return_storage_ptr__->extra_info)._M_h._M_rehash_policy._M_max_load_factor =
             (pEVar23->extra_info)._M_h._M_rehash_policy._M_max_load_factor;
        *(undefined4 *)&(__return_storage_ptr__->extra_info)._M_h._M_rehash_policy.field_0x4 = uVar7
        ;
        (__return_storage_ptr__->extra_info)._M_h._M_rehash_policy._M_next_resize = sVar5;
        (__return_storage_ptr__->extra_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)__alloc_node_gen._M_h,
                   &(pMVar20->super_QueryResult).super_BaseQueryResult.error.extra_info._M_h,
                   &__alloc_node_gen);
        goto LAB_01673710;
      }
    }
  }
  (this->config).enable_optimizer = bVar2;
  (this->config).force_external = bVar3;
  pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
            ::operator->(&original);
  pMVar20 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
            ::operator->(&pSVar14->materialized_result);
  if ((pMVar20->super_QueryResult).super_BaseQueryResult.success == true) {
    ::std::operator+(&explain_q,"EXPLAIN ",query);
    pSVar21 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
              operator->(&statement_copy_for_explain);
    original_named_param_map._M_h._M_buckets = (__buckets_ptr)0x0;
    original_named_param_map._M_h._M_bucket_count = (pSVar21->named_param_map)._M_h._M_bucket_count;
    original_named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    original_named_param_map._M_h._M_element_count =
         (pSVar21->named_param_map)._M_h._M_element_count;
    original_named_param_map._M_h._M_rehash_policy._M_max_load_factor =
         (pSVar21->named_param_map)._M_h._M_rehash_policy._M_max_load_factor;
    original_named_param_map._M_h._M_rehash_policy._4_4_ =
         *(undefined4 *)&(pSVar21->named_param_map)._M_h._M_rehash_policy.field_0x4;
    original_named_param_map._M_h._M_rehash_policy._M_next_resize =
         (pSVar21->named_param_map)._M_h._M_rehash_policy._M_next_resize;
    original_named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    __alloc_node_gen._M_h = (__hashtable_alloc *)&original_named_param_map;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,unsigned_long>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&original_named_param_map,&(pSVar21->named_param_map)._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>_>_>
                *)&__alloc_node_gen);
    this_01._M_t.
    super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
    .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true,_true>
          )operator_new(0x88);
    __alloc_node_gen._M_h =
         (__hashtable_alloc *)
         statement_copy_for_explain.
         super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
         super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    statement_copy_for_explain.
    super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (__uniq_ptr_data<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true,_true>
          )0x0;
    statement_00 = (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                    *)0x0;
    ExplainStatement::ExplainStatement
              ((ExplainStatement *)
               this_01._M_t.
               super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
               .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               &__alloc_node_gen,EXPLAIN_STANDARD,DEFAULT);
    explain_stmt.
    super_unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
    .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>)
         (unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>)
         this_01._M_t.
         super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
         .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl;
    if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
      (**(code **)(*(long *)__alloc_node_gen._M_h + 8))();
    }
    pEVar22 = unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true>
              ::operator->(&explain_stmt);
    this_02 = &(pEVar22->super_SQLStatement).named_param_map;
    if ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
         *)&original_named_param_map !=
        (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
         *)this_02) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_02,&original_named_param_map._M_h);
    }
    local_160._M_head_impl =
         (ExplainStatement *)
         explain_stmt.
         super_unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
         .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl;
    explain_stmt.
    super_unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
    .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>)
         (__uniq_ptr_data<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true,_true>
          )0x0;
    RunStatementInternal
              ((ClientContext *)local_d0,(ClientContextLock *)this,(string *)lock,statement_00,
               SUB81(&local_160,0),
               (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                )0x0,SUB81(parameters_local.ptr,0));
    if ((element_type *)local_d0._0_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_d0._0_8_)->__weak_this_)
                  .internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    local_d0._0_8_ = (element_type *)0x0;
    if ((_Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
         )local_160._M_head_impl != (ExplainStatement *)0x0) {
      (*((local_160._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    local_160._M_head_impl = (ExplainStatement *)0x0;
    if (explain_stmt.
        super_unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
        .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)explain_stmt.
                            super_unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
                            .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl +
                  8))();
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&original_named_param_map._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)explain_q._M_dataplus._M_p != &explain_q.field_2) {
      operator_delete(explain_q._M_dataplus._M_p);
    }
  }
  puVar9 = statement_verifiers.
           super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar1 != false) {
    (this->config).enable_profiler = true;
  }
  if (statement_verifiers.
      super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      statement_verifiers.
      super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar24 = statement_verifiers.
              super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar14 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator->(&original);
      pSVar15 = unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
                ::operator*(puVar24);
      StatementVerifier::CompareResults_abi_cxx11_((string *)&__alloc_node_gen,pSVar14,pSVar15);
      if (lock != (ClientContextLock *)0x0) {
        ErrorData::ErrorData(__return_storage_ptr__,(string *)&__alloc_node_gen);
        if (__alloc_node_gen._M_h != (__hashtable_alloc *)local_148) {
          operator_delete(__alloc_node_gen._M_h);
        }
        goto LAB_01673710;
      }
      if (__alloc_node_gen._M_h != (__hashtable_alloc *)local_148) {
        operator_delete(__alloc_node_gen._M_h);
      }
      puVar24 = puVar24 + 1;
    } while (puVar24 != puVar9);
  }
  ErrorData::ErrorData(__return_storage_ptr__);
LAB_01673710:
  if (statement_copy_for_explain.
      super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true,_true>)
      0x0) {
    (**(code **)(*(long *)statement_copy_for_explain.
                          super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                          .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl + 8))()
    ;
  }
  if (original.
      super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
      .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)original.
                          super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
                          .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl +
                8))();
  }
  if (prepared_statement_verifier.
      super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
      .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)prepared_statement_verifier.
                          super_unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::StatementVerifier_*,_std::default_delete<duckdb::StatementVerifier>_>
                          .super__Head_base<0UL,_duckdb::StatementVerifier_*,_false>._M_head_impl +
                8))();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
  ::~vector(&statement_verifiers.
             super_vector<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>_>_>
           );
  return __return_storage_ptr__;
}

Assistant:

ErrorData ClientContext::VerifyQuery(ClientContextLock &lock, const string &query, unique_ptr<SQLStatement> statement,
                                     optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {
	D_ASSERT(statement->type == StatementType::SELECT_STATEMENT);
	// Aggressive query verification

#ifdef DUCKDB_RUN_SLOW_VERIFIERS
	bool run_slow_verifiers = true;
#else
	bool run_slow_verifiers = false;
#endif

	// The purpose of this function is to test correctness of otherwise hard to test features:
	// Copy() of statements and expressions
	// Serialize()/Deserialize() of expressions
	// Hash() of expressions
	// Equality() of statements and expressions
	// ToString() of statements and expressions
	// Correctness of plans both with and without optimizers

	const auto &stmt = *statement;
	vector<unique_ptr<StatementVerifier>> statement_verifiers;
	unique_ptr<StatementVerifier> prepared_statement_verifier;

	// Base Statement verifiers: these are the verifiers we enable for regular builds
	if (config.query_verification_enabled) {
		statement_verifiers.emplace_back(StatementVerifier::Create(VerificationType::COPIED, stmt, parameters));
		statement_verifiers.emplace_back(StatementVerifier::Create(VerificationType::DESERIALIZED, stmt, parameters));
		statement_verifiers.emplace_back(StatementVerifier::Create(VerificationType::UNOPTIMIZED, stmt, parameters));

		// FIXME: Prepared parameter verifier is broken for queries with parameters
		if (!parameters || parameters->empty()) {
			prepared_statement_verifier = StatementVerifier::Create(VerificationType::PREPARED, stmt, parameters);
		}
	}

	// This verifier is enabled explicitly OR by enabling run_slow_verifiers
	if (config.verify_fetch_row || (run_slow_verifiers && config.query_verification_enabled)) {
		statement_verifiers.emplace_back(
		    StatementVerifier::Create(VerificationType::FETCH_ROW_AS_SCAN, stmt, parameters));
	}

	// For the DEBUG_ASYNC build we enable this extra verifier
#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (config.query_verification_enabled) {
		statement_verifiers.emplace_back(
		    StatementVerifier::Create(VerificationType::NO_OPERATOR_CACHING, stmt, parameters));
	}
#endif

	// Verify external always needs to be explicitly enabled and is never part of default verifier set
	if (config.verify_external) {
		statement_verifiers.emplace_back(StatementVerifier::Create(VerificationType::EXTERNAL, stmt, parameters));
	}

	auto original = make_uniq<StatementVerifier>(std::move(statement), parameters);
	for (auto &verifier : statement_verifiers) {
		original->CheckExpressions(*verifier);
	}
	original->CheckExpressions();

	// See below
	auto statement_copy_for_explain = stmt.Copy();

	// Save settings
	bool optimizer_enabled = config.enable_optimizer;
	bool profiling_is_enabled = config.enable_profiler;
	bool force_external = config.force_external;

	// Disable profiling if it is enabled
	if (profiling_is_enabled) {
		config.enable_profiler = false;
	}

	// Execute the original statement
	bool any_failed = original->Run(*this, query,
	                                [&](const string &q, unique_ptr<SQLStatement> s,
	                                    optional_ptr<case_insensitive_map_t<BoundParameterData>> params) {
		                                return RunStatementInternal(lock, q, std::move(s), false, params, false);
	                                });
	if (!any_failed) {
		statement_verifiers.emplace_back(
		    StatementVerifier::Create(VerificationType::PARSED, *statement_copy_for_explain, parameters));
	}
	// Execute the verifiers
	for (auto &verifier : statement_verifiers) {
		bool failed = verifier->Run(*this, query,
		                            [&](const string &q, unique_ptr<SQLStatement> s,
		                                optional_ptr<case_insensitive_map_t<BoundParameterData>> params) {
			                            return RunStatementInternal(lock, q, std::move(s), false, params, false);
		                            });
		any_failed = any_failed || failed;
	}

	if (!any_failed && prepared_statement_verifier) {
		// If none failed, we execute the prepared statement verifier
		bool failed = prepared_statement_verifier->Run(
		    *this, query,
		    [&](const string &q, unique_ptr<SQLStatement> s,
		        optional_ptr<case_insensitive_map_t<BoundParameterData>> params) {
			    return RunStatementInternal(lock, q, std::move(s), false, params, false);
		    });
		if (!failed) {
			// PreparedStatementVerifier fails if it runs into a ParameterNotAllowedException, which is OK
			statement_verifiers.push_back(std::move(prepared_statement_verifier));
		} else {
			// If it does fail, let's make sure it's not an internal exception
			ThrowIfExceptionIsInternal(*prepared_statement_verifier);
		}
	} else {
		if (ValidChecker::IsInvalidated(*db)) {
			return original->materialized_result->GetErrorObject();
		}
		if (transaction.HasActiveTransaction() && ValidChecker::IsInvalidated(ActiveTransaction())) {
			return original->materialized_result->GetErrorObject();
		}
	}

	// Restore config setting
	config.enable_optimizer = optimizer_enabled;
	config.force_external = force_external;

	// Check explain, only if q does not already contain EXPLAIN
	if (original->materialized_result->success) {
		auto explain_q = "EXPLAIN " + query;
		auto original_named_param_map = statement_copy_for_explain->named_param_map;
		auto explain_stmt = make_uniq<ExplainStatement>(std::move(statement_copy_for_explain));
		explain_stmt->named_param_map = original_named_param_map;
		try {
			RunStatementInternal(lock, explain_q, std::move(explain_stmt), false, parameters, false);
		} catch (std::exception &ex) { // LCOV_EXCL_START
			ErrorData error(ex);
			interrupted = false;
			return ErrorData("EXPLAIN failed but query did not (" + error.RawMessage() + ")");
		} // LCOV_EXCL_STOP

#ifdef DUCKDB_VERIFY_BOX_RENDERER
		// this is pretty slow, so disabled by default
		// test the box renderer on the result
		// we mostly care that this does not crash
		RandomEngine random;
		BoxRendererConfig config;
		// test with a random width
		config.max_width = random.NextRandomInteger() % 500;
		BoxRenderer renderer(config);
		renderer.ToString(*this, original->materialized_result->names, original->materialized_result->Collection());
#endif
	}

	// Restore profiler setting
	if (profiling_is_enabled) {
		config.enable_profiler = true;
	}

	// Now compare the results
	// The results of all runs should be identical
	for (auto &verifier : statement_verifiers) {
		auto result = original->CompareResults(*verifier);
		if (!result.empty()) {
			return ErrorData(result);
		}
	}

	return ErrorData();
}